

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O3

CMimePart_T * cmime_part_new(void)

{
  int iVar1;
  CMimePart_T *list;
  
  list = (CMimePart_T *)calloc(1,0x30);
  iVar1 = cmime_list_new((CMimeList_T **)list,_cmime_internal_header_destroy);
  if (iVar1 == 0) {
    list->parent_boundary = (char *)0x0;
    list->postface = (char *)0x0;
    list->content = (char *)0x0;
    list->boundary = (char *)0x0;
    list->last = 0;
  }
  else {
    free(list);
    list = (CMimePart_T *)0x0;
  }
  return list;
}

Assistant:

CMimePart_T *cmime_part_new(void) {
    CMimePart_T *part = NULL;
    
    part = (CMimePart_T *)calloc((size_t)1, sizeof(CMimePart_T));
    
    if (cmime_list_new(&part->headers,_cmime_internal_header_destroy)!=0) {
        free(part);
        return(NULL);
    }

    part->content = NULL;
    part->boundary = NULL;
    part->parent_boundary = NULL;
    part->postface = NULL;
    part->last = 0;

    return(part);
}